

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

void okim6295_write_command(okim6295_state *info,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  UINT32 offset;
  uint uVar4;
  uint uVar5;
  oki_adpcm_state *adpcm;
  int local_34;
  byte local_2d;
  int voicenum_1;
  UINT8 voicemask_1;
  UINT32 base;
  UINT32 stop;
  UINT32 start;
  okim_voice *voice;
  int voicenum;
  UINT8 voicemask;
  UINT8 data_local;
  okim6295_state *info_local;
  
  if (info->command == -1) {
    if ((data & 0x80) == 0) {
      local_2d = (byte)((int)(uint)data >> 3);
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        if ((local_2d & 1) != 0) {
          info->voice[local_34].playing = '\0';
        }
        local_2d = (byte)((int)(uint)local_2d >> 1);
      }
    }
    else {
      info->command = data & 0x7f;
    }
  }
  else {
    voice._6_1_ = (byte)((int)(uint)data >> 4);
    for (voice._0_4_ = 0; (int)voice < 4; voice._0_4_ = (int)voice + 1) {
      if (((voice._6_1_ & 1) != 0) &&
         (adpcm = &info->voice[(int)voice].adpcm, (char)adpcm[1].signal == '\0')) {
        offset = info->command * 8;
        bVar1 = memory_raw_read_byte(info,offset);
        bVar2 = memory_raw_read_byte(info,offset + 1);
        bVar3 = memory_raw_read_byte(info,offset + 2);
        uVar4 = (uint)bVar3 | (uint)bVar2 << 8 | (bVar1 & 3) << 0x10;
        bVar1 = memory_raw_read_byte(info,offset + 3);
        bVar2 = memory_raw_read_byte(info,offset + 4);
        bVar3 = memory_raw_read_byte(info,offset + 5);
        uVar5 = (uint)bVar3 | (uint)bVar2 << 8 | (bVar1 & 3) << 0x10;
        if (uVar4 < uVar5) {
          *(undefined1 *)&adpcm[1].signal = 1;
          *(uint *)&adpcm[1].field_0x4 = uVar4;
          *(undefined4 *)&adpcm[1].index_shift = 0;
          *(uint *)((long)&adpcm[1].index_shift + 4) = ((uVar5 - uVar4) + 1) * 2;
          oki_adpcm_reset(adpcm);
          *(int *)&adpcm[1].diff_lookup = volume_table[(int)(data & 0xf)];
        }
        else {
          *(undefined1 *)&adpcm[1].signal = 0;
        }
      }
      voice._6_1_ = (byte)((int)(uint)voice._6_1_ >> 1);
    }
    info->command = -1;
  }
  return;
}

Assistant:

static void okim6295_write_command(okim6295_state *info, UINT8 data)
{
	// if a command is pending, process the second half
	if (info->command != -1)
	{
		// the manual explicitly says that it's not possible to start multiple voices at the same time
		UINT8 voicemask = data >> 4;
		int voicenum;
		//if (voicemask != 0 && voicemask != 1 && voicemask != 2 && voicemask != 4 && voicemask != 8)
		//	printf("OKI6295 start %x contact MAMEDEV\n", voicemask);

		// determine which voice(s) (voice is set by a 1 bit in the upper 4 bits of the second byte)
		for (voicenum = 0; voicenum < OKIM6295_VOICES; voicenum++, voicemask >>= 1)
			if (voicemask & 1)
			{
				okim_voice *voice = &info->voice[voicenum];

				if (!voice->playing) // fixes Got-cha and Steel Force
				{
					UINT32 start, stop, base;
					// determine the start/stop positions
					base = info->command * 8;

					start  = memory_raw_read_byte(info, base + 0) << 16;
					start |= memory_raw_read_byte(info, base + 1) << 8;
					start |= memory_raw_read_byte(info, base + 2) << 0;
					start &= 0x3ffff;

					stop  = memory_raw_read_byte(info, base + 3) << 16;
					stop |= memory_raw_read_byte(info, base + 4) << 8;
					stop |= memory_raw_read_byte(info, base + 5) << 0;
					stop &= 0x3ffff;

					if (start < stop)
					{
						// set up the voice to play this sample
						voice->playing = 1;
						voice->base_offset = start;
						voice->sample = 0;
						voice->count = 2 * (stop - start + 1);

						// also reset the ADPCM parameters
						oki_adpcm_reset(&voice->adpcm);
						voice->volume = volume_table[data & 0x0f];
					}

					// invalid samples go here
					else
					{
						logerror("OKIM6295: Voice %u requested to play invalid sample %02x\n",voicenum,info->command);
						voice->playing = 0;
					}
				}
				else
				{
					// just displays warnings when seeking
					//logerror("OKIM6295: Voice %u requested to play sample %02x on non-stopped voice\n",voicenum,info->command);
				}
			}

		// reset the command
		info->command = -1;
	}

	// if this is the start of a command, remember the sample number for next time
	else if (data & 0x80)
	{
		info->command = data & 0x7f;
	}

	// otherwise, see if this is a silence command
	else
	{
		// determine which voice(s) (voice is set by a 1 bit in bits 3-6 of the command
		UINT8 voicemask = data >> 3;
		int voicenum;
		for (voicenum = 0; voicenum < OKIM6295_VOICES; voicenum++, voicemask >>= 1)
			if (voicemask & 1)
				info->voice[voicenum].playing = 0;
	}
}